

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

void remove_scrollers(Am_Object *scroll_group)

{
  bool bVar1;
  Am_Value *list_value;
  Am_Wrapper *pAVar2;
  Am_Object local_40;
  Am_Object local_38 [3];
  undefined1 local_20 [8];
  Am_Value_List components;
  Am_Object *scroll_group_local;
  
  components.item = (Am_List_Item *)scroll_group;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  list_value = Am_Object::Get(scroll_group,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)local_20,list_value);
  Am_Value_List::Start((Am_Value_List *)local_20);
  Am_Object::Get_Object(local_38,(Am_Slot_Key)scroll_group,0x1c4);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(local_38);
  bVar1 = Am_Value_List::Member((Am_Value_List *)local_20,pAVar2);
  Am_Object::~Am_Object(local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    Am_Error("Scroll group doesn\'t contain V_scroller");
  }
  Am_Value_List::Delete((Am_Value_List *)local_20,true);
  Am_Value_List::Start((Am_Value_List *)local_20);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)scroll_group,0x1c3);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_40);
  bVar1 = Am_Value_List::Member((Am_Value_List *)local_20,pAVar2);
  Am_Object::~Am_Object(&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Am_Value_List::Delete((Am_Value_List *)local_20,true);
    pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_20);
    Am_Object::Set(scroll_group,0x82,pAVar2,0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
    return;
  }
  Am_Error("Scroll group doesn\'t contain H_scroller");
}

Assistant:

void
remove_scrollers(Am_Object scroll_group)
{
  Am_Value_List components;
  components = scroll_group.Get(Am_GRAPHICAL_PARTS);
  // probably would be OK to just set the list to empty, but this is safer
  components.Start();
  if (!components.Member(scroll_group.Get_Object(Am_V_SCROLLER)))
    Am_Error("Scroll group doesn't contain V_scroller");
  components.Delete();

  components.Start();
  if (!components.Member(scroll_group.Get_Object(Am_H_SCROLLER)))
    Am_Error("Scroll group doesn't contain H_scroller");
  components.Delete();
  scroll_group.Set(Am_GRAPHICAL_PARTS, components);
}